

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# unqlite.c
# Opt level: O0

int VmProcessLongOpt(jx9_value *pKey,jx9_value *pValue,void *pUserData)

{
  int iVar1;
  bool bVar2;
  char *zTerm;
  int nByte;
  int need_value;
  char *zEnd;
  char *zOpt;
  char *zArg;
  getopt_long_opt *pOpt;
  void *pUserData_local;
  jx9_value *pValue_local;
  jx9_value *pKey_local;
  
  zTerm._4_4_ = 0;
  zArg = (char *)pUserData;
  pOpt = (getopt_long_opt *)pUserData;
  pUserData_local = pValue;
  pValue_local = pKey;
  iVar1 = jx9_value_is_string(pValue);
  if ((iVar1 != 0) &&
     (zEnd = jx9_value_to_string((jx9_value *)pUserData_local,(int *)&zTerm), 0 < (int)zTerm)) {
    _nByte = zEnd + ((int)zTerm + -1);
    if (*_nByte == ':') {
      zTerm._4_4_ = 1;
      while( true ) {
        bVar2 = false;
        if (zEnd <= _nByte) {
          bVar2 = *_nByte == ':';
        }
        if (!bVar2) break;
        _nByte = _nByte + -1;
      }
      if (_nByte <= zEnd) {
        return 0;
      }
      _nByte = _nByte + 1;
      *_nByte = '\0';
    }
    else {
      _nByte = zEnd + (int)zTerm;
    }
    zOpt = VmFindLongOpt(zEnd,(int)_nByte - (int)zEnd,*(char **)zArg,*(char **)(zArg + 8));
    if (zOpt != (char *)0x0) {
      VmExtractOptArgValue
                (*(jx9_value **)(zArg + 0x18),*(jx9_value **)(zArg + 0x10),zOpt,*(char **)(zArg + 8)
                 ,zTerm._4_4_,*(jx9_context **)(zArg + 0x20),zEnd);
    }
  }
  return 0;
}

Assistant:

static int VmProcessLongOpt(jx9_value *pKey, jx9_value *pValue, void *pUserData)
{
	struct getopt_long_opt *pOpt = (struct getopt_long_opt *)pUserData;
	const char *zArg, *zOpt, *zEnd;
	int need_value = 0;
	int nByte;
	/* Value must be of type string */
	if( !jx9_value_is_string(pValue) ){
		/* Simply ignore */
		return JX9_OK;
	}
	zOpt = jx9_value_to_string(pValue, &nByte);
	if( nByte < 1 ){
		/* Empty string, ignore */
		return JX9_OK;
	}
	zEnd = &zOpt[nByte - 1];
	if( zEnd[0] == ':' ){
		char *zTerm;
		/* Try to extract a value */
		need_value = 1;
		while( zEnd >= zOpt && zEnd[0] == ':' ){
			zEnd--;
		}
		if( zOpt >= zEnd ){
			/* Empty string, ignore */
			SXUNUSED(pKey);
			return JX9_OK;
		}
		zEnd++;
		zTerm = (char *)zEnd;
		zTerm[0] = 0;
	}else{
		zEnd = &zOpt[nByte];
	}
	/* Find the option */
	zArg = VmFindLongOpt(zOpt, (int)(zEnd-zOpt), pOpt->zArgIn, pOpt->zArgEnd);
	if( zArg == 0 ){
		/* No such option, return immediately */
		return JX9_OK;
	}
	/* Try to extract a value */
	VmExtractOptArgValue(pOpt->pArray, pOpt->pWorker, zArg, pOpt->zArgEnd, need_value, pOpt->pCtx, zOpt);
	return JX9_OK;
}